

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

void QApplication::setEffectEnabled(UIEffect effect,bool enable)

{
  uint uVar1;
  
  uVar1 = 0;
  if (effect < (UI_AnimateToolBox|UI_AnimateMenu)) {
    uVar1 = *(uint *)(&DAT_0066fb40 + (ulong)effect * 4);
  }
  if (enable) {
    QApplicationPrivate::enabledAnimations =
         uVar1 >> 1 & 0x12 | QApplicationPrivate::enabledAnimations | uVar1;
  }
  else {
    QApplicationPrivate::enabledAnimations = ~uVar1 & QApplicationPrivate::enabledAnimations;
  }
  return;
}

Assistant:

void QApplication::setEffectEnabled(Qt::UIEffect effect, bool enable)
{
    int effectFlags = uiEffectToFlag(effect);
    if (enable) {
        if (effectFlags & QPlatformTheme::FadeMenuUiEffect)
            effectFlags |= QPlatformTheme::AnimateMenuUiEffect;
        if (effectFlags & QPlatformTheme::FadeTooltipUiEffect)
            effectFlags |= QPlatformTheme::AnimateTooltipUiEffect;
        QApplicationPrivate::enabledAnimations |= effectFlags;
    } else {
        QApplicationPrivate::enabledAnimations &= ~effectFlags;
    }
}